

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

int xmlXIncludeLoadFallback(xmlXIncludeCtxtPtr ctxt,xmlNodePtr fallback,xmlXIncludeRefPtr ref)

{
  int iVar1;
  xmlNodePtr pxVar2;
  int local_2c;
  int oldNbErrors;
  int ret;
  xmlXIncludeRefPtr ref_local;
  xmlNodePtr fallback_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  local_2c = 0;
  if (((fallback == (xmlNodePtr)0x0) || (fallback->type == XML_NAMESPACE_DECL)) ||
     (ctxt == (xmlXIncludeCtxtPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (fallback->children == (_xmlNode *)0x0) {
      ref->inc = (xmlNodePtr)0x0;
    }
    else {
      iVar1 = ctxt->nbErrors;
      pxVar2 = xmlXIncludeCopyNode(ctxt,fallback,1,ref->base);
      ref->inc = pxVar2;
      if (iVar1 < ctxt->nbErrors) {
        local_2c = -1;
      }
    }
    ref->fallback = 1;
    ctxt_local._4_4_ = local_2c;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXIncludeLoadFallback(xmlXIncludeCtxtPtr ctxt, xmlNodePtr fallback,
                        xmlXIncludeRefPtr ref) {
    int ret = 0;
    int oldNbErrors;

    if ((fallback == NULL) || (fallback->type == XML_NAMESPACE_DECL) ||
        (ctxt == NULL))
	return(-1);
    if (fallback->children != NULL) {
	/*
	 * It's possible that the fallback also has 'includes'
	 * (Bug 129969), so we re-process the fallback just in case
	 */
        oldNbErrors = ctxt->nbErrors;
	ref->inc = xmlXIncludeCopyNode(ctxt, fallback, 1, ref->base);
	if (ctxt->nbErrors > oldNbErrors)
	    ret = -1;
    } else {
        ref->inc = NULL;
    }
    ref->fallback = 1;
    return(ret);
}